

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::core::ConfidentialTxInReference::EstimateTxInVsize
          (ConfidentialTxInReference *this,AddressType addr_type,Script *redeem_script,bool is_blind
          ,int exponent,int minimum_bits,Script claim_script,Script *scriptsig_template)

{
  Script claim_script_00;
  uint32_t uVar1;
  uint32_t no_witness_size;
  uint32_t witness_size;
  undefined1 local_a0 [16];
  Script *in_stack_ffffffffffffff70;
  uint32_t *in_stack_ffffffffffffff78;
  pointer in_stack_ffffffffffffff80;
  Script local_68;
  
  witness_size = 0;
  no_witness_size = 0;
  Script::Script((Script *)local_a0,redeem_script);
  Script::Script(&local_68,(Script *)claim_script._vptr_Script);
  claim_script_00.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = claim_script.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  claim_script_00._vptr_Script = (_func_int **)&local_68;
  claim_script_00.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&witness_size;
  claim_script_00.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&no_witness_size;
  claim_script_00.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = no_witness_size;
  claim_script_00.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = witness_size;
  claim_script_00.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a0._0_8_;
  claim_script_00.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_a0._8_8_;
  EstimateTxInSize(this,addr_type,(Script *)local_a0,is_blind,exponent,minimum_bits,claim_script_00,
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                   (uint32_t *)in_stack_ffffffffffffff80);
  Script::~Script(&local_68);
  Script::~Script((Script *)local_a0);
  uVar1 = AbstractTransaction::GetVsizeFromSize(no_witness_size,witness_size);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTxInReference::EstimateTxInVsize(
    AddressType addr_type, Script redeem_script, bool is_blind, int exponent,
    int minimum_bits, Script claim_script,
    const Script *scriptsig_template) const {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  EstimateTxInSize(
      addr_type, redeem_script, is_blind, exponent, minimum_bits, claim_script,
      scriptsig_template, &witness_size, &no_witness_size);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}